

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

w_status wp_log(w_log_lvl lvl,char *file,int line,char *msg,...)

{
  char in_AL;
  w_status wVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list args;
  w_status status;
  char *msg_local;
  int line_local;
  char *file_local;
  w_log_lvl lvl_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (file == (char *)0x0) {
    w_handle_failed_assertion
              ("file != NULL","wp_log",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xcb);
  }
  if (msg == (char *)0x0) {
    w_handle_failed_assertion
              ("msg != NULL","wp_log",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xcc);
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x20;
  wVar1 = wp_log_va(lvl,file,line,msg,(__va_list_tag *)local_48);
  return wVar1;
}

Assistant:

enum w_status
wp_log(
    enum w_log_lvl lvl,
    const char *file,
    int line,
    const char *msg,
    ...
)
{
    enum w_status status;
    va_list args;

    W_ASSERT(file != NULL);
    W_ASSERT(msg != NULL);

    va_start(args, msg);
    status = wp_log_va(lvl, file, line, msg, args);
    va_end(args);
    return status;
}